

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_tiled_irreg_proc_grid64(int g_a,int64_t *mapc,int64_t *nblocks,int64_t *proc_grid)

{
  long in_RCX;
  long in_RDX;
  int in_EDI;
  int i_1;
  int i;
  Integer _proc_grid [7];
  Integer _nblocks [7];
  Integer *_ga_map_capi;
  Integer ndim;
  Integer aa;
  int local_c0;
  int local_bc;
  undefined8 local_b8 [3];
  int64_t *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Integer *in_stack_ffffffffffffff70;
  Integer *in_stack_ffffffffffffff78;
  Integer in_stack_ffffffffffffff80;
  undefined8 local_78 [8];
  Integer *local_38;
  Integer local_30;
  long local_28;
  long local_20;
  long local_18;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_30 = pnga_get_dimension(local_28);
  local_38 = copy_map64(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                        in_stack_ffffffffffffff60);
  for (local_bc = 0; local_bc < local_30; local_bc = local_bc + 1) {
    local_78[(local_30 - local_bc) + -1] = *(undefined8 *)(local_18 + (long)local_bc * 8);
  }
  for (local_c0 = 0; local_c0 < local_30; local_c0 = local_c0 + 1) {
    local_b8[(local_30 - local_c0) + -1] = *(undefined8 *)(local_20 + (long)local_c0 * 8);
  }
  pnga_set_tiled_irreg_proc_grid
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (Integer *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  free(local_38);
  return;
}

Assistant:

void NGA_Set_tiled_irreg_proc_grid64(int g_a, int64_t mapc[], int64_t nblocks[],
    int64_t proc_grid[])
{
    Integer aa, ndim;
    Integer *_ga_map_capi;
    Integer _nblocks[MAXDIM];
    Integer _proc_grid[MAXDIM];

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    _ga_map_capi = copy_map64(nblocks, (int)ndim, mapc);
    COPYC2F(nblocks,_nblocks, ndim);
    COPYC2F(proc_grid, _proc_grid, ndim);

    wnga_set_tiled_irreg_proc_grid(aa, _ga_map_capi, _nblocks, _proc_grid);
    free(_ga_map_capi);
}